

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_date * mg_date_copy_ca(mg_date *src,mg_allocator *allocator)

{
  mg_allocator *in_RSI;
  int64_t *in_RDI;
  mg_date *date;
  mg_date *local_8;
  
  if (in_RDI == (int64_t *)0x0) {
    local_8 = (mg_date *)0x0;
  }
  else {
    local_8 = mg_date_alloc(in_RSI);
    if (local_8 == (mg_date *)0x0) {
      local_8 = (mg_date *)0x0;
    }
    else {
      local_8->days = *in_RDI;
    }
  }
  return local_8;
}

Assistant:

mg_date *mg_date_copy_ca(const mg_date *src, mg_allocator *allocator) {
  if (!src) {
    return NULL;
  }
  mg_date *date = mg_date_alloc(allocator);
  if (!date) {
    return NULL;
  }
  memcpy(date, src, sizeof(mg_date));
  return date;
}